

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestCase(FILE *out,TestCase *test_case)

{
  pointer ppTVar1;
  pointer ppTVar2;
  pointer piVar3;
  undefined8 uVar4;
  uint uVar5;
  pointer ppTVar6;
  TimeInMillis extraout_RDX;
  TimeInMillis extraout_RDX_00;
  TimeInMillis ms;
  ulong uVar7;
  long lVar8;
  stringstream stream;
  char *local_1c8 [2];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  EscapeXml((XmlUnitTestResultPrinter *)local_1b8,(test_case->name_).c_str_,true);
  uVar4 = local_1b8._0_8_;
  ppTVar1 = (test_case->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppTVar2 = (test_case->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = TestCase::failed_test_count(test_case);
  uVar7 = 0;
  for (ppTVar6 = (test_case->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar6 !=
      (test_case->test_info_list_).
      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppTVar6 = ppTVar6 + 1) {
    uVar7 = (ulong)((int)uVar7 + (uint)(*ppTVar6)->is_disabled_);
  }
  fprintf((FILE *)out,"  <testsuite name=\"%s\" tests=\"%d\" failures=\"%d\" disabled=\"%d\" ",uVar4
          ,(ulong)((long)ppTVar1 - (long)ppTVar2) >> 3 & 0xffffffff,(ulong)uVar5,uVar7);
  ms = extraout_RDX;
  if ((_func_int **)local_1b8._0_8_ != (_func_int **)0x0) {
    operator_delete__((void *)local_1b8._0_8_);
    ms = extraout_RDX_00;
  }
  FormatTimeInMillisAsSeconds_abi_cxx11_
            ((string *)local_1b8,(internal *)test_case->elapsed_time_,ms);
  fprintf((FILE *)out,"errors=\"0\" time=\"%s\">\n",local_1b8._0_8_);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
  }
  if (0 < (int)((ulong)((long)(test_case->test_info_list_).
                              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(test_case->test_info_list_).
                             super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar8 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      piVar3 = (test_case->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = 0xffffffff;
      if (lVar8 < (int)((ulong)((long)(test_case->test_indices_).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)piVar3) >> 2)) {
        uVar5 = piVar3[lVar8];
      }
      OutputXmlTestInfo((ostream *)(local_1b8 + 0x10),(test_case->name_).c_str_,
                        (test_case->test_info_list_).
                        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar5]);
      StringStreamToString((internal *)local_1c8,(stringstream *)local_1b8);
      fputs(local_1c8[0],(FILE *)out);
      if (local_1c8[0] != (char *)0x0) {
        operator_delete__(local_1c8[0]);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (int)((ulong)((long)(test_case->test_info_list_).
                                         super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(test_case->test_info_list_).
                                        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  fwrite("  </testsuite>\n",0xf,1,(FILE *)out);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestCase(FILE* out,
                                                const TestCase& test_case) {
  fprintf(out,
          "  <testsuite name=\"%s\" tests=\"%d\" failures=\"%d\" "
          "disabled=\"%d\" ",
          EscapeXmlAttribute(test_case.name()).c_str(),
          test_case.total_test_count(),
          test_case.failed_test_count(),
          test_case.disabled_test_count());
  fprintf(out,
          "errors=\"0\" time=\"%s\">\n",
          FormatTimeInMillisAsSeconds(test_case.elapsed_time()).c_str());
  for (int i = 0; i < test_case.total_test_count(); ++i) {
    ::std::stringstream stream;
    OutputXmlTestInfo(&stream, test_case.name(), *test_case.GetTestInfo(i));
    fprintf(out, "%s", StringStreamToString(&stream).c_str());
  }
  fprintf(out, "  </testsuite>\n");
}